

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexConcaveCollisionAlgorithm.cpp
# Opt level: O0

void __thiscall
btConvexTriangleCallback::btConvexTriangleCallback
          (btConvexTriangleCallback *this,btDispatcher *dispatcher,
          btCollisionObjectWrapper *body0Wrap,btCollisionObjectWrapper *body1Wrap,bool isSwapped)

{
  btCollisionObject *pbVar1;
  btCollisionObject *pbVar2;
  _func_int **pp_Var3;
  _func_int **in_RCX;
  _func_int **in_RDX;
  _func_int **in_RSI;
  btTriangleCallback *in_RDI;
  byte in_R8B;
  _func_int **local_50;
  _func_int **local_48;
  
  btTriangleCallback::btTriangleCallback(in_RDI);
  in_RDI->_vptr_btTriangleCallback = (_func_int **)&PTR__btConvexTriangleCallback_002e2ff8;
  btVector3::btVector3((btVector3 *)(in_RDI + 3));
  btVector3::btVector3((btVector3 *)(in_RDI + 5));
  in_RDI[8]._vptr_btTriangleCallback = in_RSI;
  in_RDI[9]._vptr_btTriangleCallback = (_func_int **)0x0;
  local_48 = in_RDX;
  if ((in_R8B & 1) != 0) {
    local_48 = in_RCX;
  }
  in_RDI[1]._vptr_btTriangleCallback = local_48;
  local_50 = in_RCX;
  if ((in_R8B & 1) != 0) {
    local_50 = in_RDX;
  }
  in_RDI[2]._vptr_btTriangleCallback = local_50;
  pp_Var3 = in_RDI[8]._vptr_btTriangleCallback;
  pbVar1 = btCollisionObjectWrapper::getCollisionObject
                     ((btCollisionObjectWrapper *)in_RDI[1]._vptr_btTriangleCallback);
  pbVar2 = btCollisionObjectWrapper::getCollisionObject
                     ((btCollisionObjectWrapper *)in_RDI[2]._vptr_btTriangleCallback);
  pp_Var3 = (_func_int **)(**(code **)(*pp_Var3 + 0x18))(pp_Var3,pbVar1,pbVar2);
  in_RDI[0xb]._vptr_btTriangleCallback = pp_Var3;
  clearCache((btConvexTriangleCallback *)0x192836);
  return;
}

Assistant:

btConvexTriangleCallback::btConvexTriangleCallback(btDispatcher*  dispatcher,const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap,bool isSwapped):
	  m_dispatcher(dispatcher),
	m_dispatchInfoPtr(0)
{
	m_convexBodyWrap = isSwapped? body1Wrap:body0Wrap;
	m_triBodyWrap = isSwapped? body0Wrap:body1Wrap;
	
	  //
	  // create the manifold from the dispatcher 'manifold pool'
	  //
	  m_manifoldPtr = m_dispatcher->getNewManifold(m_convexBodyWrap->getCollisionObject(),m_triBodyWrap->getCollisionObject());

  	  clearCache();
}